

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Vfs_lstat(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  int iVar2;
  jx9_value *pjVar3;
  jx9_value *pjVar4;
  char *pcVar5;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pvVar1 = pCtx->pFunc->pUserData;
    if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0xb8) == 0)) {
      jx9_context_throw_error_format
                (pCtx,2,
                 "IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE",
                 (pCtx->pFunc->sName).zString);
    }
    else {
      pjVar3 = jx9_context_new_array(pCtx);
      pjVar4 = jx9_context_new_scalar(pCtx);
      if (pjVar4 == (jx9_value *)0x0 || pjVar3 == (jx9_value *)0x0) {
        jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"JX9 is running out of memory");
      }
      else {
        pcVar5 = jx9_value_to_string(*apArg,(int *)0x0);
        iVar2 = (**(code **)((long)pvVar1 + 0xb8))(pcVar5,pjVar3,pjVar4);
        if (iVar2 == 0) {
          jx9_result_value(pCtx,pjVar3);
          return 0;
        }
      }
    }
  }
  pjVar3 = pCtx->pRet;
  jx9MemObjRelease(pjVar3);
  (pjVar3->x).rVal = 0.0;
  pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Vfs_lstat(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray, *pValue;
	const char *zPath;
	jx9_vfs *pVfs;
	int rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xlStat == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Create the array and the working value */
	pArray = jx9_context_new_array(pCtx);
	pValue = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pValue == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zPath = jx9_value_to_string(apArg[0], 0);
	/* Perform the requested operation */
	rc = pVfs->xlStat(zPath, pArray, pValue);
	if( rc != JX9_OK ){
		/* IO error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the associative array */
		jx9_result_value(pCtx, pArray);
	}
	/* Don't worry about freeing memory here, everything will be released
	 * automatically as soon we return from this function. */
	return JX9_OK;
}